

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Dist_graph_neighbors
              (MPIABI_Comm comm,int maxindeegree,int *sources,int *wourceweights,int maxoutdegree,
              int *destinations,int *destweights)

{
  int iVar1;
  
  iVar1 = MPI_Dist_graph_neighbors();
  return iVar1;
}

Assistant:

int MPIABI_Dist_graph_neighbors(
  MPIABI_Comm comm,
  int maxindeegree,
  int * sources,
  int * wourceweights,
  int maxoutdegree,
  int * destinations,
  int * destweights
) {
  return MPI_Dist_graph_neighbors(
    (MPI_Comm)(WPI_Comm)comm,
    maxindeegree,
    sources,
    wourceweights,
    maxoutdegree,
    destinations,
    destweights
  );
}